

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<123UL> * __thiscall
mserialize::cx_strcat<41ul,41ul,41ul>
          (cx_string<123UL> *__return_storage_ptr__,mserialize *this,cx_string<41UL> *strings,
          cx_string<41UL> *strings_1,cx_string<41UL> *strings_2)

{
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  char buffer [124];
  ulong auStack_c8 [5];
  mserialize *local_a0;
  cx_string<41UL> *local_98;
  cx_string<41UL> *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined4 uStack_20;
  undefined4 local_1c;
  undefined4 uStack_18;
  undefined8 uStack_14;
  
  puVar1 = &local_88;
  uStack_18 = 0;
  uStack_14 = 0;
  uStack_28 = 0;
  uStack_20 = 0;
  local_1c = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_a0 = this;
  local_98 = strings;
  local_90 = strings_1;
  auStack_c8[1] = 0x29;
  auStack_c8[2] = 0x29;
  auStack_c8[3] = 0x29;
  lVar2 = 1;
  do {
    if (auStack_c8[lVar2] != 0) {
      uVar3 = 0;
      do {
        *(undefined1 *)((long)puVar1 + uVar3) = *(undefined1 *)(auStack_c8[lVar2 + 4] + uVar3);
        uVar3 = uVar3 + 1;
      } while (uVar3 < auStack_c8[lVar2]);
      puVar1 = (undefined8 *)((long)puVar1 + uVar3);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  __return_storage_ptr__->_data[0x7b] = '\0';
  memcpy(__return_storage_ptr__,&local_88,0x7b);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}